

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

void StateGetHandCard(pyhanabi_state_t *state,int pid,int index,pyhanabi_card_t *card)

{
  const_reference this;
  pyhanabi_card_t *ppVar1;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x1a7,"void StateGetHandCard(pyhanabi_state_t *, int, int, pyhanabi_card_t *)");
  }
  if (state->state != (void *)0x0) {
    if (card != (pyhanabi_card_t *)0x0) {
      this = std::
             vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ::at((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                   *)((long)state->state + 0x40),(long)pid);
      ppVar1 = (pyhanabi_card_t *)
               std::
               vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ::at(&this->cards_,(long)index);
      *card = *ppVar1;
      return;
    }
    __assert_fail("card != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x1a9,"void StateGetHandCard(pyhanabi_state_t *, int, int, pyhanabi_card_t *)");
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x1a8,"void StateGetHandCard(pyhanabi_state_t *, int, int, pyhanabi_card_t *)");
}

Assistant:

void StateGetHandCard(pyhanabi_state_t* state, int pid, int index,
                      pyhanabi_card_t* card) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  REQUIRE(card != nullptr);
  hanabi_learning_env::HanabiCard hanabi_card =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
          ->Hands()
          .at(pid)
          .Cards()
          .at(index);
  card->color = hanabi_card.Color();
  card->rank = hanabi_card.Rank();
}